

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O3

_Bool cfg_parse_simple_object(json_value *value,config_item *items)

{
  uint uVar1;
  json_value *value_00;
  int *piVar2;
  json_value *value_01;
  char **ppcVar3;
  _Bool _Var4;
  config_item *item;
  void *pvVar5;
  config_item *pcVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  int priority;
  char *pcVar10;
  config_item *pcVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  
  if ((value == (json_value *)0x0) || (value->type != json_object)) {
    _Var4 = false;
  }
  else {
    iVar9 = (value->u).boolean;
    _Var4 = true;
    if (0 < (long)iVar9) {
      lVar8 = 0;
      do {
        pcVar10 = (value->u).string.ptr;
        pcVar7 = *(char **)(pcVar10 + lVar8 * 0x18);
        item = cfg_find_item(pcVar7,items);
        if (item == (config_item *)0x0) {
          pcVar10 = "Unrecognized attribute: %s";
          iVar9 = 0x1a8;
          goto LAB_00105914;
        }
        value_00 = *(json_value **)(pcVar10 + lVar8 * 0x18 + 0x10);
        if (value_00 == (json_value *)0x0) {
          pcVar10 = "NULL pointers passed in!";
          iVar9 = 0x164;
LAB_001058a5:
          pcVar7 = "save_object_value";
          priority = 7;
          goto LAB_001058ad;
        }
        _Var4 = is_same_type(value_00,item);
        if (!_Var4) {
          pcVar10 = "Type mismatch: %s";
          iVar9 = 0x168;
          goto LAB_001058a5;
        }
        switch(value_00->type) {
        case json_object:
          if ((item->subitems != (config_item *)0x0) &&
             (_Var4 = cfg_parse_simple_object(value_00,item->subitems), !_Var4)) goto LAB_001058f1;
          break;
        case json_array:
          if (item->list == false) goto LAB_001058f1;
          uVar1 = (value_00->u).boolean;
          if ((ulong)uVar1 == 0) {
            item->vcount = 0;
            break;
          }
          uVar13 = (ulong)item->type;
          switch(item->type) {
          case cdt_bool:
            break;
          case cdt_uint16:
            uVar13 = 2;
            break;
          case cdt_int:
            uVar13 = 4;
            break;
          case cdt_double:
          case cdt_string:
            uVar13 = 8;
            break;
          case cdt_object:
            if (item->subitems_init_cb == (_func_config_item_t_ptr_uint *)0x0) {
              pcVar7 = "save_list_values";
              pcVar10 = "Object array has no init callback associated: %s";
              iVar9 = 0xfe;
              goto LAB_001059ef;
            }
            pcVar6 = (*item->subitems_init_cb)(uVar1);
            if (pcVar6 != (config_item_t *)0x0) {
              item->subitems = pcVar6;
              item->vcount = uVar1;
              if (0 < (int)uVar1) {
                uVar13 = 0;
LAB_001057f0:
                _Var4 = cfg_parse_simple_object
                                  (*(json_value **)((value_00->u).string.ptr + uVar13 * 8),pcVar6);
                if (_Var4) goto code_r0x00105809;
                _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c"
                           ,0x108,"save_list_values",0,7,"Failed to handle object array: %s",
                           pcVar6->key);
                pcVar6 = item->subitems;
                do {
                  cfg_reset_items(pcVar6);
                  pcVar11 = pcVar6;
                  if (pcVar6 == (config_item *)0x0) {
                    pcVar6 = (config_item *)0x0;
                  }
                  else {
                    do {
                      pcVar6 = pcVar11 + 1;
                      ppcVar3 = &pcVar11->key;
                      pcVar11 = pcVar6;
                    } while (*ppcVar3 != (char *)0x0);
                  }
                  iVar9 = (int)uVar13;
                  uVar13 = (ulong)(iVar9 - 1);
                } while (0 < iVar9);
                if (item->subitems_free_cb != (_func_void_config_item_t_ptr_uint *)0x0) {
                  (*item->subitems_free_cb)(item->subitems,uVar1);
                }
                item->subitems = (config_item_t *)0x0;
                item->vcount = 0;
                goto LAB_001058f1;
              }
              goto LAB_001057a5;
            }
            goto LAB_001058f1;
          default:
            pcVar7 = "save_list_values";
            pcVar10 = "Config item of type %d is not supported!";
            iVar9 = 0x12d;
            goto LAB_001059ef;
          }
          pvVar5 = malloc(uVar13 * (long)(int)uVar1);
          item->value = pvVar5;
          item->_malloc = pvVar5;
          if (pvVar5 == (void *)0x0) {
            pcVar7 = "save_list_values";
            pcVar10 = "Out of memory!";
            iVar9 = 0x133;
LAB_001059ef:
            priority = 3;
LAB_001058ad:
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                       iVar9,pcVar7,0,priority,pcVar10);
            goto LAB_001058f1;
          }
          if (0 < (int)uVar1) {
            lVar12 = 0;
            do {
              value_01 = *(json_value **)((value_00->u).string.ptr + lVar12 * 8);
              _Var4 = is_same_type(value_01,item);
              if (!_Var4) goto LAB_001058bd;
              switch(item->type) {
              case cdt_bool:
                *(bool *)((long)item->value + lVar12) = (value_01->u).boolean != 0;
                break;
              case cdt_uint16:
                *(undefined2 *)((long)item->value + lVar12 * 2) = *(undefined2 *)&value_01->u;
                break;
              case cdt_int:
                *(int *)((long)item->value + lVar12 * 4) = (value_01->u).boolean;
                break;
              case cdt_double:
                *(int64_t *)((long)item->value + lVar12 * 8) = (value_01->u).integer;
                break;
              case cdt_string:
                pcVar10 = acopy_string((char **)(lVar12 * 8 + (long)item->value),value_01);
                bVar14 = pcVar10 != (char *)0x0;
                goto LAB_00105783;
              default:
                goto switchD_00105725_default;
              }
              bVar14 = true;
LAB_00105783:
              lVar12 = lVar12 + 1;
            } while ((lVar12 < (int)uVar1) && (bVar14));
            if (!bVar14) goto LAB_001058bd;
          }
          item->vcount = uVar1;
          break;
        case json_integer:
          piVar2 = (int *)item->value;
          if (item->type == cdt_uint16) {
            if (piVar2 != (int *)0x0) {
              *(undefined2 *)piVar2 = *(undefined2 *)&value_00->u;
            }
          }
          else if (piVar2 != (int *)0x0) {
            *piVar2 = (value_00->u).boolean;
          }
          break;
        case json_double:
          if ((int64_t *)item->value != (int64_t *)0x0) {
            *(int64_t *)item->value = (value_00->u).integer;
          }
          break;
        case json_string:
          if ((char **)item->value != (char **)0x0) {
            pcVar10 = acopy_string((char **)item->value,value_00);
            item->_malloc = pcVar10;
            if (pcVar10 == (char *)0x0) goto LAB_001058f1;
          }
          break;
        case json_boolean:
          if (item->value != (void *)0x0) {
            *(bool *)item->value = (value_00->u).boolean != 0;
          }
          break;
        default:
          pcVar7 = "save_object_value";
          pcVar10 = "Type %d of JSON is not supported!";
          iVar9 = 0x18c;
          goto LAB_001059ef;
        }
LAB_001057a5:
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar9);
      _Var4 = true;
    }
  }
  return _Var4;
code_r0x00105809:
  pcVar11 = pcVar6;
  if (pcVar6 == (config_item *)0x0) {
    pcVar6 = (config_item *)0x0;
  }
  else {
    do {
      pcVar6 = pcVar11 + 1;
      ppcVar3 = &pcVar11->key;
      pcVar11 = pcVar6;
    } while (*ppcVar3 != (char *)0x0);
  }
  uVar13 = uVar13 + 1;
  if (uVar13 == uVar1) goto LAB_001057a5;
  goto LAB_001057f0;
LAB_001058bd:
  if (item->type == cdt_string) {
    lVar8 = lVar12 + 1;
    do {
      pvVar5 = *(void **)((long)item->value + lVar8 * 8 + -8);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
      }
      lVar12 = lVar8 + -1;
      bVar14 = 0 < lVar8;
      lVar8 = lVar12;
    } while (lVar12 != 0 && bVar14);
  }
switchD_00105725_default:
  free(item->_malloc);
  item->value = (void *)0x0;
  item->_malloc = (void *)0x0;
LAB_001058f1:
  pcVar7 = item->key;
  pcVar10 = "Failed to parse attributes in: %s";
  iVar9 = 0x1a3;
LAB_00105914:
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",iVar9,
             "cfg_parse_simple_object",0,3,pcVar10,pcVar7);
  return false;
}

Assistant:

bool cfg_parse_simple_object(json_value * value, config_item * items)
{
    int i, n;
    config_item * item;
    json_object_entry * obj;
   
    // accept object only
    if (value == NULL || value->type != json_object)
        return false;

    n = value->u.object.length;
    for (i = 0; i < n; i ++) {
        obj = value->u.object.values + i;
        item = cfg_find_item(obj->name, items);
        if (item) {
            if (!save_object_value(obj->value, item)) {
                // Invalid value type
                log_error(LOG_ERR, "Failed to parse attributes in: %s", item->key);
                return false;
            }
        }
        else {
            log_error(LOG_ERR, "Unrecognized attribute: %s", obj->name);
            return false;
        }
    }
    return true;
}